

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory.cpp
# Opt level: O1

void __thiscall
xmrig::VirtualMemory::VirtualMemory
          (VirtualMemory *this,size_t size,bool hugePages,bool usePool,uint32_t node,
          size_t alignSize)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint8_t *in_RAX;
  uint8_t *puVar5;
  undefined7 in_register_00000009;
  size_t __alignment;
  uint8_t *local_28;
  
  this->m_size = (size - 1 & 0xffffffffffe00000) + 0x200000;
  this->m_node = node;
  (this->m_flags).super__Base_bitset<1UL>._M_w = 0;
  this->m_scratchpad = (uint8_t *)0x0;
  local_28 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,usePool) == 0) {
LAB_00187c76:
    if ((!hugePages) || (bVar2 = allocateLargePagesMemory(this), !bVar2)) {
      if (alignSize == 1) {
        local_28 = (uint8_t *)malloc(this->m_size);
      }
      else {
        __alignment = 8;
        if (8 < alignSize) {
          __alignment = alignSize;
        }
        if ((alignSize & alignSize - 1) != 0) {
          __alignment = alignSize;
        }
        iVar4 = posix_memalign(&local_28,__alignment,this->m_size);
        if (iVar4 != 0) {
          local_28 = (uint8_t *)0x0;
        }
      }
      this->m_scratchpad = local_28;
    }
    return;
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  if (((!hugePages) || (cVar1 = (**(code **)(*pool + 0x10))(pool,node), cVar1 != '\0')) ||
     (bVar2 = allocateLargePagesMemory(this), !bVar2)) {
    puVar5 = (uint8_t *)(**(code **)(*pool + 0x18))(pool,this->m_size,node);
    this->m_scratchpad = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)mutex);
      goto LAB_00187c76;
    }
    bVar3 = (**(code **)(*pool + 0x10))(pool,node);
    (this->m_flags).super__Base_bitset<1UL>._M_w =
         (ulong)bVar3 + ((this->m_flags).super__Base_bitset<1UL>._M_w & 0xfffffffffffffffa) + 4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  return;
}

Assistant:

xmrig::VirtualMemory::VirtualMemory(size_t size, bool hugePages, bool usePool, uint32_t node, size_t alignSize) :
    m_size(align(size)),
    m_node(node)
{
    if (usePool) {
        std::lock_guard<std::mutex> lock(mutex);
        if (hugePages && !pool->isHugePages(node) && allocateLargePagesMemory()) {
            return;
        }

        m_scratchpad = pool->get(m_size, node);
        if (m_scratchpad) {
            m_flags.set(FLAG_HUGEPAGES, pool->isHugePages(node));
            m_flags.set(FLAG_EXTERNAL,  true);

            return;
        }
    }

    if (hugePages && allocateLargePagesMemory()) {
        return;
    }

    m_scratchpad = static_cast<uint8_t*>(_mm_malloc(m_size, alignSize));
}